

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void * UnityNumToPtr(UNITY_INT num,UNITY_UINT8 size)

{
  anon_union_8_5_71dd1706 aVar1;
  undefined3 in_register_00000031;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000031,size);
  aVar1 = (anon_union_8_5_71dd1706)num;
  if (iVar2 != 8) {
    if (iVar2 == 2) {
      UnityQuickCompare.i16 = (short)num;
      aVar1 = UnityQuickCompare;
    }
    else if (iVar2 == 1) {
      UnityQuickCompare.i8 = (char)num;
      aVar1 = UnityQuickCompare;
    }
    else {
      UnityQuickCompare.i32 = (int)num;
      aVar1 = UnityQuickCompare;
    }
  }
  UnityQuickCompare = aVar1;
  return &UnityQuickCompare;
}

Assistant:

UNITY_INTERNAL_PTR UnityNumToPtr(const UNITY_INT num, const UNITY_UINT8 size)
{
    switch(size)
    {
        case 1:
            UnityQuickCompare.i8 = (UNITY_INT8)num;
            return (UNITY_INTERNAL_PTR)(&UnityQuickCompare.i8);

        case 2:
            UnityQuickCompare.i16 = (UNITY_INT16)num;
            return (UNITY_INTERNAL_PTR)(&UnityQuickCompare.i16);

#ifdef UNITY_SUPPORT_64
        case 8:
            UnityQuickCompare.i64 = (UNITY_INT64)num;
            return (UNITY_INTERNAL_PTR)(&UnityQuickCompare.i64);
#endif

        default: /* 4 bytes */
            UnityQuickCompare.i32 = (UNITY_INT32)num;
            return (UNITY_INTERNAL_PTR)(&UnityQuickCompare.i32);
    }
}